

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O3

void __thiscall CppUnit::TestPath::removeTest(TestPath *this,int index)

{
  ulong uVar1;
  ulong uVar2;
  iterator local_58;
  iterator local_38;
  
  checkIndexValid(this,index);
  local_58._M_cur =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_58._M_node =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar1 = ((long)local_58._M_cur -
           (long)(this->m_tests).
                 super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + (long)index;
  if ((long)uVar1 < 0) {
    uVar2 = (long)uVar1 >> 6;
  }
  else {
    if (uVar1 < 0x40) {
      local_58._M_cur = local_58._M_cur + index;
      local_58._M_first = *local_58._M_node;
      goto LAB_0012ad26;
    }
    uVar2 = uVar1 >> 6;
  }
  local_58._M_node = local_58._M_node + uVar2;
  local_58._M_first = *local_58._M_node;
  local_58._M_cur = local_58._M_first + uVar1 + uVar2 * -0x40;
LAB_0012ad26:
  local_58._M_last = local_58._M_first + 0x40;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_M_erase
            (&local_38,&this->m_tests,&local_58);
  return;
}

Assistant:

void 
TestPath::removeTest( int index )
{
  checkIndexValid( index );
  m_tests.erase( m_tests.begin() + index );
}